

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O3

void cmExtraEclipseCDT4Generator::AppendTarget
               (cmGeneratedFileStream *fout,string *target,string *make,string *makeArgs,
               string *path,char *prefix,char *makeTarget)

{
  pointer pcVar1;
  size_t sVar2;
  ostream *poVar3;
  string pathXml;
  string makeTargetXml;
  string targetXml;
  string local_d8;
  string local_b8;
  long *local_98;
  long local_90;
  long local_88 [2];
  string *local_78;
  string local_70;
  string local_50;
  
  local_78 = makeArgs;
  EscapeForXML(&local_70,target);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  if (makeTarget != (char *)0x0) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    sVar2 = strlen(makeTarget);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,makeTarget,makeTarget + sVar2);
    EscapeForXML(&local_b8,&local_d8);
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
  }
  EscapeForXML(&local_50,target);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  EscapeForXML(&local_b8,path);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"<target name=\"",0xe);
  if (prefix == (char *)0x0) {
    std::ios::clear((int)fout +
                    (int)(fout->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(prefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,prefix,sVar2);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" path=\"",8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\" targetID=\"org.eclipse.cdt.make.MakeTargetBuilder\">\n<buildCommand>",0x43);
  pcVar1 = (make->_M_dataplus)._M_p;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar1,pcVar1 + make->_M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"</buildCommand>\n<buildArguments>",0x20);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(local_78->_M_dataplus)._M_p,local_78->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</buildArguments>\n<buildTarget>",0x1f)
  ;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_98,local_90);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "</buildTarget>\n<stopOnError>true</stopOnError>\n<useDefaultCommand>false</useDefaultCommand>\n</target>\n"
             ,0x66);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendTarget(cmGeneratedFileStream& fout,
                                               const std::string&     target,
                                               const std::string&     make,
                                               const std::string&     makeArgs,
                                               const std::string&     path,
                                               const char* prefix,
                                               const char* makeTarget
                                              )
{
  std::string targetXml = cmExtraEclipseCDT4Generator::EscapeForXML(target);
  std::string makeTargetXml = targetXml;
  if (makeTarget != NULL)
    {
    makeTargetXml = cmExtraEclipseCDT4Generator::EscapeForXML(makeTarget);
    }
  cmExtraEclipseCDT4Generator::EscapeForXML(target);
  std::string pathXml = cmExtraEclipseCDT4Generator::EscapeForXML(path);
  fout <<
    "<target name=\"" << prefix << targetXml << "\""
    " path=\"" << pathXml << "\""
    " targetID=\"org.eclipse.cdt.make.MakeTargetBuilder\">\n"
    "<buildCommand>"
    << cmExtraEclipseCDT4Generator::GetEclipsePath(make)
    << "</buildCommand>\n"
    "<buildArguments>"  << makeArgs << "</buildArguments>\n"
    "<buildTarget>" << makeTargetXml << "</buildTarget>\n"
    "<stopOnError>true</stopOnError>\n"
    "<useDefaultCommand>false</useDefaultCommand>\n"
    "</target>\n"
    ;
}